

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O2

void __thiscall
ritobin::io::impl_binary_write::BinaryWriter::write<unsigned_int>(BinaryWriter *this,uint value)

{
  char buffer [4];
  char local_4 [4];
  
  std::vector<char,std::allocator<char>>::insert<char*,void>
            ((vector<char,std::allocator<char>> *)this->buffer_,
             (const_iterator)*(char **)((vector<char,std::allocator<char>> *)this->buffer_ + 8),
             local_4,&stack0x00000000);
  return;
}

Assistant:

void write(T value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            char buffer[sizeof(value)];
            memcpy(buffer, &value, sizeof(value));
            buffer_.insert(buffer_.end(), buffer, buffer + sizeof(buffer));
        }